

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# excl.c
# Opt level: O0

int nn_excl_recv(nn_excl *self,nn_msg *msg)

{
  FILE *__stream;
  char *pcVar1;
  nn_msg *in_RDI;
  int rc;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  uint uVar2;
  
  if (*(long *)((long)&(in_RDI->sphdr).u + 8) == 0) {
    uVar2 = 0xfffffff5;
  }
  else {
    uVar2 = nn_pipe_recv((nn_pipe *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                         in_RDI);
    if ((int)uVar2 < 0) {
      nn_backtrace_print();
      __stream = _stderr;
      pcVar1 = nn_err_strerror((int)((ulong)_stderr >> 0x20));
      fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar1,(ulong)-uVar2,
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/protocols/utils/excl.c"
              ,0x65);
      fflush(_stderr);
      nn_err_abort();
    }
    if ((uVar2 & 1) != 0) {
      *(undefined8 *)((long)&(in_RDI->sphdr).u + 8) = 0;
    }
    uVar2 = uVar2 & 0xfffffffe;
  }
  return uVar2;
}

Assistant:

int nn_excl_recv (struct nn_excl *self, struct nn_msg *msg)
{
    int rc;

    if (nn_slow (!self->inpipe))
        return -EAGAIN;

    rc = nn_pipe_recv (self->inpipe, msg);
    errnum_assert (rc >= 0, -rc);

    if (rc & NN_PIPE_RELEASE)
        self->inpipe = NULL;

    return rc & ~NN_PIPE_RELEASE;
}